

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O0

bool __thiscall hmm::createMaps(hmm *this)

{
  mapped_type mVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  long in_RDI;
  bool bVar9;
  __type _Var10;
  string previousCount2;
  string previousCount1;
  int numGCPos;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  undefined4 local_7c;
  undefined4 local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  byte local_1;
  
  local_14 = 0;
  local_18 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"0",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"0",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  do {
    while( true ) {
      uVar3 = (ulong)local_14;
      uVar4 = std::__cxx11::string::size();
      bVar9 = false;
      if (uVar3 < uVar4) {
        uVar3 = (ulong)local_14;
        uVar4 = std::__cxx11::string::size();
        bVar9 = false;
        if (uVar3 < uVar4) {
          uVar3 = (ulong)local_14;
          uVar4 = std::__cxx11::string::size();
          bVar9 = false;
          if (uVar3 < uVar4) {
            uVar3 = (ulong)local_14;
            uVar4 = std::__cxx11::string::size();
            bVar9 = uVar3 < uVar4;
          }
        }
      }
      if (!bVar9) {
        *(int *)(in_RDI + 0x1c0) = local_18;
        if (*(int *)(in_RDI + 0x1c0) < *(int *)(in_RDI + 0x248)) {
          local_1 = 0;
        }
        else {
          local_1 = 1;
        }
        goto LAB_00273402;
      }
      pcVar5 = (char *)std::__cxx11::string::at(in_RDI + 0x1c8);
      if ((*pcVar5 == 'O') ||
         (pcVar5 = (char *)std::__cxx11::string::at(in_RDI + 0x1c8), *pcVar5 == 'C')) break;
      bVar9 = std::operator==(in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8);
      if ((bVar9) ||
         (bVar9 = std::operator==(in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8),
         bVar9)) {
        in_stack_fffffffffffffdd8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::at(in_RDI + 0x1c8);
        std::__cxx11::string::operator=(local_38,(char)in_stack_fffffffffffffdd8->_M_dataplus);
        in_stack_fffffffffffffdd0 = (char *)std::__cxx11::string::at(in_RDI + 0x208);
        std::__cxx11::string::operator=(local_70,*in_stack_fffffffffffffdd0);
      }
      else {
        std::__cxx11::string::at(in_RDI + 0x1c8);
        std::operator+(in_stack_fffffffffffffdd8,(char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
        in_stack_fffffffffffffdb8 = &local_c0;
        std::__cxx11::string::operator=(local_38,(string *)in_stack_fffffffffffffdb8);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffdc0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::at(in_RDI + 0x208);
        std::operator+(in_stack_fffffffffffffdd8,(char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
        std::__cxx11::string::operator=(local_70,local_e0);
        std::__cxx11::string::~string(local_e0);
      }
LAB_002733a1:
      local_14 = local_14 + 1;
    }
    pcVar5 = (char *)std::__cxx11::string::at(in_RDI + 0x208);
    if ((*pcVar5 != 'O') &&
       (pcVar5 = (char *)std::__cxx11::string::at(in_RDI + 0x208), *pcVar5 != 'C')) {
      local_1 = 0;
      goto LAB_00273402;
    }
    bVar9 = std::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    if (bVar9) {
      local_1 = 0;
LAB_00273402:
      local_78 = 1;
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_38);
      return (bool)(local_1 & 1);
    }
    if (local_18 != 0) {
      pmVar7 = (mapped_type *)std::__cxx11::string::at(in_RDI + 0x1c8);
      mVar1 = *pmVar7;
      local_90 = local_18 + 1;
      pmVar7 = std::
               unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
               ::operator[]((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                             *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
      *pmVar7 = mVar1;
      std::__cxx11::string::at(in_RDI + 0x1e8);
      _Var10 = std::pow<int,double>
                         ((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                          (double)in_stack_fffffffffffffdb8);
      local_94 = local_18 + 1;
      pmVar8 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
      *pmVar8 = _Var10;
      pmVar7 = (mapped_type *)std::__cxx11::string::at(in_RDI + 0x208);
      mVar1 = *pmVar7;
      local_98 = local_18 + 1;
      pmVar7 = std::
               unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
               ::operator[]((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                             *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
      *pmVar7 = mVar1;
      std::__cxx11::string::at(in_RDI + 0x228);
      _Var10 = std::pow<int,double>
                         ((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                          (double)in_stack_fffffffffffffdb8);
      local_9c = local_18 + 1;
      pmVar8 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
      *pmVar8 = _Var10;
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffdc0,(size_t *)in_stack_fffffffffffffdb8,0);
      local_a0 = local_18 + 1;
      pmVar6 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
      *pmVar6 = iVar2;
      local_18 = local_18 + 1;
      std::__cxx11::string::operator=(local_38,"0");
      std::__cxx11::string::operator=(local_70,"0");
      goto LAB_002733a1;
    }
    local_7c = 1;
    pmVar6 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
    *pmVar6 = 0;
    pmVar7 = (mapped_type *)std::__cxx11::string::at(in_RDI + 0x1c8);
    mVar1 = *pmVar7;
    local_80 = local_18 + 1;
    pmVar7 = std::
             unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
             ::operator[]((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                           *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
    *pmVar7 = mVar1;
    std::__cxx11::string::at(in_RDI + 0x1e8);
    _Var10 = std::pow<int,double>
                       ((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                        (double)in_stack_fffffffffffffdb8);
    local_84 = local_18 + 1;
    pmVar8 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
    *pmVar8 = _Var10;
    pmVar7 = (mapped_type *)std::__cxx11::string::at(in_RDI + 0x208);
    mVar1 = *pmVar7;
    local_88 = local_18 + 1;
    pmVar7 = std::
             unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
             ::operator[]((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                           *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
    *pmVar7 = mVar1;
    std::__cxx11::string::at(in_RDI + 0x228);
    _Var10 = std::pow<int,double>
                       ((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                        (double)in_stack_fffffffffffffdb8);
    local_8c = local_18 + 1;
    pmVar8 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_fffffffffffffdc0,(key_type *)in_stack_fffffffffffffdb8);
    *pmVar8 = _Var10;
    std::__cxx11::string::operator=(local_38,"0");
    std::__cxx11::string::operator=(local_70,"0");
    local_18 = local_18 + 1;
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool hmm::createMaps(){
    int i = 0;
    int numGCPos = 0;
    string previousCount1 = "0";
    string previousCount2 = "0";
    //cout<<"here1"<<endl;
    while(i<this->code1.size() && i<this->qual1.size() && i<this->code2.size() && i<this->qual2.size()){
        //cout<<"here2: "<<i<<endl;
        if(this->code1.at(i)=='O'||this->code1.at(i)=='C'){
            if(this->code2.at(i)=='O'||this->code2.at(i)=='C'){
                if(previousCount1!=previousCount2){
                    return false;
                }
                if(numGCPos==0){
                    distanceMap[numGCPos+1] = (0);
                    observedChroma1[numGCPos+1] = (this->code1.at(i));
                    this->qualityMap1[numGCPos+1] = (pow(10,(-this->qual1.at(i)/(double)10)));
                    //qualityMap1.push_back(qual1.at(i));
                    observedChroma2[numGCPos+1] = (this->code2.at(i));
                    qualityMap2[numGCPos+1] = (pow(10,(-this->qual2.at(i)/(double)10)));
                    //qualityMap2.push_back(qual2.at(i));
                    previousCount1 = "0";
                    previousCount2 = "0";
                    numGCPos += 1;
                    i++;
                    continue;
                }
                observedChroma1[numGCPos+1] = (this->code1.at(i));
                qualityMap1[numGCPos+1] = (pow(10,(-this->qual1.at(i)/(double)10)));
                //qualityMap1.push_back(qual1.at(i));
                observedChroma2[numGCPos+1] = (this->code2.at(i));
                qualityMap2[numGCPos+1] = (pow(10,(-this->qual2.at(i)/(double)10)));
                //qualityMap2.push_back(qual2.at(i));
                distanceMap[numGCPos+1] = std::stoi(previousCount1);
                numGCPos += 1;
                previousCount1 = "0";
                previousCount2 = "0";
            }else{
                return false;
            }
        }else{
            if(previousCount1=="0"||previousCount2=="0"){
                previousCount1 = code1.at(i);
                previousCount2 = code2.at(i);
            }else{
                previousCount1 = previousCount1 + code1.at(i);
                previousCount2 = previousCount2 + code2.at(i);
            }
        }
        i++;
    }
    T = numGCPos;
    if(T<this->minGCPositions){
        return false;
    }
    return true;
}